

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AddError
          (DescriptorBuilder *this,string_view element_name,Message *descriptor,
          ErrorLocation location,
          FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          make_error)

{
  ErrorCollector *pEVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  LogMessage *pLVar4;
  undefined4 extraout_EDX;
  undefined1 auVar5 [16];
  LogMessage local_90;
  Voidify local_7d [21];
  LogMessage local_68;
  Voidify local_51;
  undefined1 local_50 [8];
  string error;
  ErrorLocation location_local;
  Message *descriptor_local;
  DescriptorBuilder *this_local;
  string_view element_name_local;
  
  error.field_2._12_4_ = location;
  absl::lts_20250127::
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  operator()((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             &make_error);
  if (this->error_collector_ == (ErrorCollector *)0x0) {
    if ((this->had_errors_ & 1U) == 0) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                (&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0x144c);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar4,(char (*) [36])"Invalid proto descriptor for file \"");
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,&this->filename_);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(char (*) [3])"\":");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar4);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_68);
    }
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x144f);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(char (*) [3])0x6a78a7)
    ;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,element_name);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(char (*) [3])0x6679c1)
    ;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(string *)local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(local_7d,pLVar4);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_90);
  }
  else {
    pEVar1 = this->error_collector_;
    auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->filename_);
    uVar2 = error.field_2._12_4_;
    uVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
    (*pEVar1->_vptr_ErrorCollector[2])
              (pEVar1,auVar5._0_8_,auVar5._8_8_,element_name._M_len,element_name._M_str,descriptor,
               uVar2,uVar3,extraout_EDX);
  }
  this->had_errors_ = true;
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

PROTOBUF_NOINLINE void DescriptorBuilder::AddError(
    const absl::string_view element_name, const Message& descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location,
    absl::FunctionRef<std::string()> make_error) {
  std::string error = make_error();
  if (error_collector_ == nullptr) {
    if (!had_errors_) {
      ABSL_LOG(ERROR) << "Invalid proto descriptor for file \"" << filename_
                      << "\":";
    }
    ABSL_LOG(ERROR) << "  " << element_name << ": " << error;
  } else {
    error_collector_->RecordError(filename_, element_name, &descriptor,
                                  location, error);
  }
  had_errors_ = true;
}